

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar5.c
# Opt level: O3

wchar_t process_head_file_extra(archive_read *a,archive_entry *e,rar5 *rar,ssize_t extra_data_size)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  archive_entry *paVar4;
  uint64_t uVar5;
  uint64_t *puVar6;
  wchar_t wVar7;
  wchar_t wVar8;
  char *pcVar9;
  char *pcVar10;
  uint64_t uVar11;
  char *pcVar12;
  undefined8 *puVar13;
  void *pvVar14;
  int64_t iVar15;
  byte unix_time;
  uint64_t value_size;
  uint64_t v_4;
  uint64_t flags;
  uint64_t id;
  uint64_t v;
  long local_20c0;
  archive_entry *local_20b8;
  uint64_t local_20b0;
  archive_string local_20a8;
  uint64_t local_2090;
  uint64_t local_2088;
  uint64_t *local_2080;
  uint64_t *local_2078;
  char *local_2070;
  uint8_t *local_2068;
  rar5 *local_2060;
  uint32_t *local_2058;
  uint64_t *local_2050;
  uint64_t *local_2048;
  uint64_t *local_2040;
  archive_string local_2038 [341];
  
  if (extra_data_size < 1) {
    wVar7 = L'\xffffffe2';
  }
  else {
    local_2078 = &(rar->file).redir_type;
    local_2080 = &(rar->file).redir_flags;
    local_2040 = &(rar->file).e_mtime;
    local_2048 = &(rar->file).e_ctime;
    local_2050 = &(rar->file).e_atime;
    local_2058 = &(rar->file).e_unix_ns;
    local_2068 = (rar->file).blake2sp;
    local_20b8 = e;
    local_2060 = rar;
    do {
      local_20a8.s = (char *)0x0;
      wVar7 = read_var(a,(uint64_t *)local_2038,(uint64_t *)&local_20a8);
      pcVar10 = local_20a8.s;
      if ((wVar7 == L'\0') ||
         (pcVar9 = (char *)__archive_read_consume(a,(int64_t)local_20a8.s), pcVar9 != pcVar10)) {
        return L'\x01';
      }
      local_20a8.s = (char *)0x0;
      wVar7 = read_var(a,(uint64_t *)local_2038,(uint64_t *)&local_20a8);
      pcVar12 = local_2038[0].s;
      pcVar9 = local_20a8.s;
      if (wVar7 == L'\0') {
        return L'\x01';
      }
      extra_data_size = extra_data_size - (long)(pcVar10 + (long)local_20a8.s);
      local_20c0 = extra_data_size;
      pcVar10 = (char *)__archive_read_consume(a,(int64_t)local_20a8.s);
      if (pcVar10 != pcVar9) {
        return L'\x01';
      }
      switch(pcVar12) {
      case (char *)0x2:
        local_20a8.s = (char *)0x0;
        wVar7 = read_var(a,(uint64_t *)local_2038,(uint64_t *)&local_20a8);
        pcVar9 = local_2038[0].s;
        pcVar10 = local_20a8.s;
        if (wVar7 == L'\0') {
LAB_00690474:
          wVar7 = L'\x01';
        }
        else {
          extra_data_size = extra_data_size - (long)local_20a8.s;
          local_20c0 = extra_data_size;
          pcVar12 = (char *)__archive_read_consume(a,(int64_t)local_20a8.s);
          wVar7 = L'\x01';
          if (pcVar12 == pcVar10) {
            if (pcVar9 == (char *)0x0) {
              local_2038[0].s = (char *)0xffffffffffffffff;
              puVar13 = (undefined8 *)__archive_read_ahead(a,0x20,(ssize_t *)local_2038);
              if (puVar13 != (undefined8 *)0x0) {
                (local_2060->file).has_blake2 = '\x01';
                uVar1 = *puVar13;
                uVar2 = puVar13[1];
                uVar3 = puVar13[3];
                *(undefined8 *)(local_2068 + 0x10) = puVar13[2];
                *(undefined8 *)(local_2068 + 0x18) = uVar3;
                *(undefined8 *)local_2068 = uVar1;
                *(undefined8 *)(local_2068 + 8) = uVar2;
                iVar15 = __archive_read_consume(a,0x20);
                if (iVar15 == 0x20) {
                  extra_data_size = extra_data_size + -0x20;
                  local_20c0 = extra_data_size;
LAB_006905e8:
                  wVar7 = L'\0';
                  break;
                }
              }
LAB_00690690:
              wVar7 = L'\x01';
            }
            else {
              archive_set_error(&a->archive,0x54,"Unsupported hash type (0x%x)");
              wVar7 = L'\xffffffe2';
            }
          }
        }
        break;
      case (char *)0x3:
        local_20a8.s = (char *)0x0;
        wVar7 = read_var(a,(uint64_t *)local_2038,(uint64_t *)&local_20a8);
        pcVar9 = local_2038[0].s;
        pcVar10 = local_20a8.s;
        if (wVar7 == L'\0') goto LAB_00690474;
        extra_data_size = extra_data_size - (long)local_20a8.s;
        local_20c0 = extra_data_size;
        pcVar12 = (char *)__archive_read_consume(a,(int64_t)local_20a8.s);
        puVar6 = local_2040;
        wVar7 = L'\x01';
        if (pcVar12 == pcVar10) {
          unix_time = (byte)pcVar9 & 1;
          if (((ulong)pcVar9 & 2) != 0) {
            parse_htime_item(a,unix_time,local_2040,&local_20c0);
            archive_entry_set_mtime(local_20b8,*puVar6,0);
          }
          puVar6 = local_2048;
          if (((ulong)pcVar9 & 4) != 0) {
            parse_htime_item(a,unix_time,local_2048,&local_20c0);
            archive_entry_set_ctime(local_20b8,*puVar6,0);
          }
          puVar6 = local_2050;
          if (((ulong)pcVar9 & 8) != 0) {
            parse_htime_item(a,unix_time,local_2050,&local_20c0);
            archive_entry_set_atime(local_20b8,*puVar6,0);
          }
          if (((ulong)pcVar9 & 0x10) == 0) {
            wVar7 = L'\0';
            extra_data_size = local_20c0;
          }
          else {
            wVar7 = read_u32(a,local_2058);
            extra_data_size = local_20c0;
            if (wVar7 == L'\0') goto LAB_00690690;
            local_20c0 = local_20c0 + -4;
            wVar7 = L'\0';
            extra_data_size = local_20c0;
          }
        }
        break;
      case (char *)0x4:
        local_20a8.s = (char *)0x0;
        wVar8 = read_var(a,(uint64_t *)local_2038,(uint64_t *)&local_20a8);
        pcVar10 = local_20a8.s;
        wVar7 = L'\x01';
        if (wVar8 != L'\0') {
          extra_data_size = extra_data_size - (long)local_20a8.s;
          local_20c0 = extra_data_size;
          pcVar9 = (char *)__archive_read_consume(a,(int64_t)local_20a8.s);
          if (pcVar9 == pcVar10) {
            local_20a8.s = (char *)0x0;
            wVar7 = read_var(a,(uint64_t *)local_2038,(uint64_t *)&local_20a8);
            pcVar10 = local_20a8.s;
            if (wVar7 != L'\0') {
              local_2070 = local_2038[0].s;
              extra_data_size = extra_data_size - (long)local_20a8.s;
              local_20c0 = extra_data_size;
              pcVar9 = (char *)__archive_read_consume(a,(int64_t)local_20a8.s);
              paVar4 = local_20b8;
              if (pcVar9 == pcVar10) {
                pcVar10 = archive_entry_pathname_utf8(local_20b8);
                if (pcVar10 != (char *)0x0) {
                  local_2038[0].s = (char *)0x0;
                  local_2038[0].length = 0;
                  local_2038[0].buffer_length = 0;
                  local_20a8.s = (char *)0x0;
                  local_20a8.length = 0;
                  local_20a8.buffer_length = 0;
                  archive_string_sprintf(local_2038,";%zu",local_2070);
                  archive_strcat(&local_20a8,pcVar10);
                  archive_strcat(&local_20a8,local_2038[0].s);
                  archive_entry_update_pathname_utf8(paVar4,local_20a8.s);
                  archive_string_free(local_2038);
                  archive_string_free(&local_20a8);
                  goto LAB_006905e8;
                }
                archive_set_error(&a->archive,0x16,"Version entry without file name");
                wVar7 = L'\xffffffe2';
                break;
              }
            }
          }
          wVar7 = L'\x01';
        }
        break;
      case (char *)0x5:
        local_20a8.s = (char *)0x0;
        wVar8 = read_var(a,local_2078,(uint64_t *)&local_20a8);
        pcVar10 = local_20a8.s;
        wVar7 = L'\x01';
        if (wVar8 != L'\0') {
          pcVar9 = (char *)__archive_read_consume(a,(int64_t)local_20a8.s);
          if (pcVar9 == pcVar10) {
            extra_data_size = extra_data_size - (long)local_20a8.s;
            local_20c0 = extra_data_size;
            wVar7 = read_var(a,local_2080,(uint64_t *)&local_20a8);
            pcVar10 = local_20a8.s;
            if ((wVar7 != L'\0') &&
               (pcVar9 = (char *)__archive_read_consume(a,(int64_t)local_20a8.s), pcVar9 == pcVar10)
               ) {
              extra_data_size = extra_data_size - (long)local_20a8.s;
              local_20c0 = extra_data_size;
              wVar7 = read_var(a,(uint64_t *)local_2038,(uint64_t *)0x0);
              pcVar10 = local_2038[0].s;
              if (wVar7 != L'\0') {
                extra_data_size = extra_data_size + ~(ulong)local_2038[0].s;
                local_2038[0].s = (char *)0xffffffffffffffff;
                local_20c0 = extra_data_size;
                pvVar14 = __archive_read_ahead(a,(size_t)pcVar10,(ssize_t *)local_2038);
                if (pvVar14 != (void *)0x0) {
                  if (pcVar10 < (char *)0x800) {
                    if (pcVar10 != (char *)0x0) {
                      memcpy(local_2038,pvVar14,(size_t)pcVar10);
                      pcVar10[(long)&local_2038[0].s] = '\0';
                      pcVar9 = (char *)__archive_read_consume(a,(int64_t)pcVar10);
                      paVar4 = local_20b8;
                      if (pcVar9 != pcVar10) goto LAB_00690690;
                      wVar7 = L'\0';
                      if (*local_2078 - 1 < 2) {
                        archive_entry_set_filetype(local_20b8,0xa000);
                        archive_entry_update_symlink_utf8(paVar4,(char *)local_2038);
                        if ((*local_2080 & 1) == 0) {
                          wVar7 = L'\x01';
                        }
                        else {
                          wVar7 = L'\x02';
                        }
                        archive_entry_set_symlink_type(paVar4,wVar7);
                      }
                      else {
                        if (*local_2078 != 4) break;
                        archive_entry_set_filetype(local_20b8,0x8000);
                        archive_entry_update_hardlink_utf8(paVar4,(char *)local_2038);
                      }
                      goto LAB_00690798;
                    }
                    pcVar10 = "No link target specified";
                  }
                  else {
                    pcVar10 = "Link target is too long";
                  }
                  archive_set_error(&a->archive,0x54,pcVar10);
                  wVar7 = L'\xffffffe2';
                  break;
                }
              }
            }
          }
          goto LAB_00690690;
        }
        break;
      case (char *)0x6:
        local_2090 = 0;
        local_20b0 = 0;
        local_2088 = 0;
        wVar8 = read_var(a,&local_2090,&local_20b0);
        uVar5 = local_20b0;
        wVar7 = L'\x01';
        if (wVar8 != L'\0') {
          uVar11 = __archive_read_consume(a,local_20b0);
          if (uVar11 == uVar5) {
            extra_data_size = extra_data_size - local_20b0;
            local_20c0 = extra_data_size;
            if ((local_2090 & 1) == 0) {
LAB_00690088:
              if ((local_2090 & 2) == 0) {
LAB_00690090:
                if ((local_2090 & 4) != 0) {
                  wVar7 = read_var(a,&local_2088,&local_20b0);
                  uVar5 = local_20b0;
                  if ((wVar7 == L'\0') ||
                     (uVar11 = __archive_read_consume(a,local_20b0), uVar11 != uVar5))
                  goto LAB_00690690;
                  extra_data_size = extra_data_size - local_20b0;
                  local_20c0 = extra_data_size;
                  archive_entry_set_uid(local_20b8,local_2088);
                }
                if ((local_2090 & 8) != 0) {
                  wVar7 = read_var(a,&local_2088,&local_20b0);
                  uVar5 = local_20b0;
                  if ((wVar7 == L'\0') ||
                     (uVar11 = __archive_read_consume(a,local_20b0), uVar11 != uVar5))
                  goto LAB_00690690;
                  extra_data_size = extra_data_size - local_20b0;
                  local_20c0 = extra_data_size;
                  archive_entry_set_gid(local_20b8,local_2088);
                }
LAB_00690798:
                wVar7 = L'\0';
                break;
              }
              wVar7 = read_var(a,(uint64_t *)&local_20a8,(uint64_t *)0x0);
              pcVar10 = local_20a8.s;
              if (wVar7 != L'\0') {
                extra_data_size = extra_data_size + ~(ulong)local_20a8.s;
                local_20a8.s = (char *)0xffffffffffffffff;
                local_20c0 = extra_data_size;
                pvVar14 = __archive_read_ahead(a,(size_t)pcVar10,(ssize_t *)&local_20a8);
                if (pvVar14 != (void *)0x0) {
                  pcVar9 = (char *)0xff;
                  if (pcVar10 < (char *)0xff) {
                    pcVar9 = pcVar10;
                  }
                  memcpy(local_2038,pvVar14,(size_t)pcVar9);
                  pcVar9[(long)&local_2038[0].s] = '\0';
                  pcVar9 = (char *)__archive_read_consume(a,(int64_t)pcVar10);
                  if (pcVar9 == pcVar10) {
                    archive_entry_set_gname(local_20b8,(char *)local_2038);
                    goto LAB_00690090;
                  }
                }
              }
            }
            else {
              wVar7 = read_var(a,(uint64_t *)local_2038,(uint64_t *)0x0);
              pcVar10 = local_2038[0].s;
              if (wVar7 != L'\0') {
                extra_data_size = extra_data_size + ~(ulong)local_2038[0].s;
                local_2038[0].s = (char *)0xffffffffffffffff;
                local_20c0 = extra_data_size;
                pvVar14 = __archive_read_ahead(a,(size_t)pcVar10,(ssize_t *)local_2038);
                if (pvVar14 != (void *)0x0) {
                  pcVar9 = (char *)0xff;
                  if (pcVar10 < (char *)0xff) {
                    pcVar9 = pcVar10;
                  }
                  memcpy(local_2038,pvVar14,(size_t)pcVar9);
                  pcVar9[(long)&local_2038[0].s] = '\0';
                  pcVar9 = (char *)__archive_read_consume(a,(int64_t)pcVar10);
                  if (pcVar9 == pcVar10) {
                    archive_entry_set_uname(local_20b8,(char *)local_2038);
                    goto LAB_00690088;
                  }
                }
              }
            }
          }
          goto LAB_00690690;
        }
        break;
      default:
        iVar15 = __archive_read_consume(a,extra_data_size);
        if (iVar15 == extra_data_size) {
          return L'\0';
        }
        return L'\xffffffe2';
      }
    } while (0 < extra_data_size);
  }
  return wVar7;
}

Assistant:

static int process_head_file_extra(struct archive_read* a,
    struct archive_entry* e, struct rar5* rar, ssize_t extra_data_size)
{
	size_t extra_field_size;
	size_t extra_field_id = 0;
	int ret = ARCHIVE_FATAL;
	size_t var_size;

	while(extra_data_size > 0) {
		if(!read_var_sized(a, &extra_field_size, &var_size))
			return ARCHIVE_EOF;

		extra_data_size -= var_size;
		if(ARCHIVE_OK != consume(a, var_size)) {
			return ARCHIVE_EOF;
		}

		if(!read_var_sized(a, &extra_field_id, &var_size))
			return ARCHIVE_EOF;

		extra_data_size -= var_size;
		if(ARCHIVE_OK != consume(a, var_size)) {
			return ARCHIVE_EOF;
		}

		switch(extra_field_id) {
			case EX_HASH:
				ret = parse_file_extra_hash(a, rar,
				    &extra_data_size);
				break;
			case EX_HTIME:
				ret = parse_file_extra_htime(a, e, rar,
				    &extra_data_size);
				break;
			case EX_REDIR:
				ret = parse_file_extra_redir(a, e, rar,
				    &extra_data_size);
				break;
			case EX_UOWNER:
				ret = parse_file_extra_owner(a, e,
				    &extra_data_size);
				break;
			case EX_VERSION:
				ret = parse_file_extra_version(a, e,
				    &extra_data_size);
				break;
			case EX_CRYPT:
				/* fallthrough */
			case EX_SUBDATA:
				/* fallthrough */
			default:
				/* Skip unsupported entry. */
				return consume(a, extra_data_size);
		}
	}

	if(ret != ARCHIVE_OK) {
		/* Attribute not implemented. */
		return ret;
	}

	return ARCHIVE_OK;
}